

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
context<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::
pop(context<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    *this)

{
  __normal_iterator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_**,_std::vector<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>_>
  local_20;
  const_iterator local_18;
  context<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_10;
  context<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  local_10 = this;
  local_20._M_current =
       (basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        **)Catch::clara::std::
           vector<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
           ::begin(&this->items_);
  __gnu_cxx::
  __normal_iterator<kainjow::mustache::basic_data<std::__cxx11::wstring>const*const*,std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>const*,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>const*>>>
  ::__normal_iterator<kainjow::mustache::basic_data<std::__cxx11::wstring>const**>
            ((__normal_iterator<kainjow::mustache::basic_data<std::__cxx11::wstring>const*const*,std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>const*,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>const*>>>
              *)&local_18,&local_20);
  Catch::clara::std::
  vector<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  ::erase(&this->items_,local_18);
  return;
}

Assistant:

virtual void pop() override {
        items_.erase(items_.begin());
    }